

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int attach_set_handle(ATTACH_HANDLE attach,handle handle_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ATTACH_INSTANCE *attach_instance;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x1039;
  }
  else {
    item_value = amqpvalue_create_uint(handle_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1041;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,1,item_value);
      iVar2 = 0x1047;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_handle(ATTACH_HANDLE attach, handle handle_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE handle_amqp_value = amqpvalue_create_handle(handle_value);
        if (handle_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 1, handle_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(handle_amqp_value);
        }
    }

    return result;
}